

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImGuiTableCellData *pIVar1;
  ImVec4 *pIVar2;
  ImVec2 IVar3;
  char cVar4;
  short sVar5;
  ImGuiWindow *pIVar6;
  ImDrawList *pIVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  undefined1 auVar10 [16];
  ImGuiContext *pIVar11;
  int iVar12;
  ImGuiTableColumn *p_1;
  ImGuiTableInstanceData *pIVar13;
  ImGuiTableColumn *pIVar14;
  char *__function;
  ImGuiTableColumn *p;
  long lVar15;
  ImGuiTableColumn *pIVar16;
  int iVar17;
  int iVar18;
  ImGuiTableCellData *cell_data;
  ImGuiTableCellData *pIVar19;
  int iVar20;
  ImU32 col;
  ImU32 col_00;
  uint uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uVar29;
  undefined1 auVar28 [16];
  float fVar30;
  float fVar31;
  float fVar33;
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  ImRect IVar35;
  ImVec2 local_80;
  ImVec2 local_78;
  ImU32 local_70;
  int local_6c;
  int local_68;
  int local_64;
  ImVec2 local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pIVar11 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  if (pIVar6 != table->InnerWindow) {
    __assert_fail("window == table->InnerWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x6d0,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->IsInsideRow == false) {
    __assert_fail("table->IsInsideRow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x6d1,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  if (pIVar11->LogEnabled == true) {
    LogRenderedText((ImVec2 *)0x0,"|",(char *)0x0);
  }
  fVar31 = table->RowPosY2;
  auVar27 = ZEXT416((uint)fVar31);
  (pIVar6->DC).CursorPos.y = fVar31;
  fVar30 = table->RowPosY1;
  auVar23 = ZEXT416((uint)fVar30);
  iVar12 = table->CurrentRow;
  iVar17 = (int)table->FreezeRowsCount;
  iVar20 = (int)table->FreezeRowsRequest;
  if (iVar12 == 0) {
    sVar5 = table->InstanceCurrent;
    if (sVar5 == 0) {
      pIVar13 = &table->InstanceDataFirst;
    }
    else {
      if ((sVar5 < 1) || ((table->InstanceDataExtra).Size < (int)sVar5)) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                      ,0x703,
                      "T &ImVector<ImGuiTableInstanceData>::operator[](int) [T = ImGuiTableInstanceData]"
                     );
      }
      pIVar13 = (table->InstanceDataExtra).Data + ((ulong)(uint)(int)sVar5 - 1);
    }
    pIVar13->LastFirstRowHeight = fVar31 - fVar30;
  }
  iVar18 = iVar12 + 1;
  if (((table->InnerClipRect).Min.y <= fVar31) && (fVar30 <= (table->InnerClipRect).Max.y)) {
    col_00 = table->RowBgColor[0];
    local_68 = iVar20;
    local_58 = auVar23;
    local_48 = auVar27;
    if ((col_00 == 0x1000000) && (col_00 = 0, (table->Flags & 0x40) != 0)) {
      col_00 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
      iVar12 = table->CurrentRow;
    }
    col = table->RowBgColor[1];
    local_70 = 0;
    if (col == 0x1000000) {
      col = 0;
    }
    if (((0 < iVar12) || (table->InnerWindow == table->OuterWindow)) &&
       (local_70 = 0, (table->Flags & 0x80) != 0)) {
      local_70 = table->RowBgColor[(ulong)((table->field_0x9a & 1) == 0) + 2];
    }
    cVar4 = table->RowCellDataCurrent;
    local_64 = iVar17;
    if ((-1 < cVar4 || iVar18 == iVar17) || (local_70 != 0 || (col != 0 || col_00 != 0))) {
      if ((table->Flags & 0x100000) == 0) {
        fVar31 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar30 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar33 = (table->Bg0ClipRectForDrawCmd).Max.y;
        pIVar7 = pIVar6->DrawList;
        (pIVar7->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar7->_CmdHeader).ClipRect.y = fVar31;
        (pIVar7->_CmdHeader).ClipRect.z = fVar30;
        (pIVar7->_CmdHeader).ClipRect.w = fVar33;
      }
      ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar6->DrawList,0);
    }
    if (col != 0 || col_00 != 0) {
      IVar3 = (table->BgClipRect).Min;
      fVar31 = (table->WorkRect).Min.x;
      fVar30 = IVar3.x;
      fVar33 = IVar3.y;
      uVar21 = -(uint)(fVar30 <= fVar31);
      uVar22 = -(uint)(fVar33 <= (float)local_58._0_4_);
      auVar34._0_4_ = (uint)fVar31 & uVar21;
      auVar34._4_4_ = local_58._0_4_ & uVar22;
      auVar34._8_4_ = 0;
      auVar34._12_4_ = local_58._4_4_ & -(uint)(0.0 <= (float)local_58._4_4_);
      auVar26._0_4_ = ~uVar21 & (uint)fVar30;
      auVar26._4_4_ = ~uVar22 & (uint)fVar33;
      auVar26._8_8_ = 0;
      auVar27 = auVar26 | auVar34;
      local_80 = auVar27._0_8_;
      auVar32._8_8_ = 0;
      auVar32._0_4_ = (table->BgClipRect).Max.x;
      auVar32._4_4_ = (table->BgClipRect).Max.y;
      auVar23._4_4_ = local_48._0_4_;
      auVar23._0_4_ = (table->WorkRect).Max.x;
      auVar23._8_4_ = 0;
      auVar23._12_4_ = local_48._4_4_;
      auVar23 = minps(auVar23,auVar32);
      local_78 = auVar23._0_8_;
      if ((col_00 != 0) &&
         (uVar21 = -(uint)(auVar27._4_4_ < auVar23._4_4_),
         auVar10._4_4_ = -(uint)(auVar27._8_4_ < auVar23._8_4_), auVar10._0_4_ = uVar21,
         auVar10._8_4_ = -(uint)(auVar27._12_4_ < auVar23._12_4_), auVar10._12_4_ = 0,
         auVar27 = auVar10 << 0x20, (uVar21 & 1) != 0)) {
        ImDrawList::AddRectFilled(pIVar6->DrawList,&local_80,&local_78,col_00,0.0,0);
      }
      if (col != 0) {
        if (local_80.y < local_78.y) {
          ImDrawList::AddRectFilled(pIVar6->DrawList,&local_80,&local_78,col,0.0,0);
        }
      }
    }
    local_6c = iVar18;
    if (-1 < cVar4) {
      if (-1 < (long)table->RowCellDataCurrent) {
        pIVar19 = (table->RowCellData).Data;
        pIVar1 = pIVar19 + table->RowCellDataCurrent;
        if (pIVar1 < (table->RowCellData).DataEnd) {
          do {
            uVar29 = auVar27._8_8_;
            cVar4 = pIVar19->Column;
            if (((long)cVar4 < 0) ||
               (pIVar14 = (table->Columns).Data + cVar4, (table->Columns).DataEnd <= pIVar14))
            goto LAB_0019704d;
            IVar35 = TableGetCellBgRect(table,(int)cVar4);
            auVar28._0_8_ = IVar35.Max;
            auVar28._8_8_ = uVar29;
            IVar3 = (table->BgClipRect).Min;
            fVar31 = IVar3.x;
            fVar30 = IVar3.y;
            uVar21 = -(uint)(fVar31 <= IVar35.Min.x);
            uVar22 = -(uint)(fVar30 <= IVar35.Min.y);
            fVar33 = (float)(~uVar21 & (uint)fVar31 | (uint)IVar35.Min.x & uVar21);
            auVar24._8_8_ = 0;
            auVar24._0_4_ = (table->BgClipRect).Max.x;
            auVar24._4_4_ = (table->BgClipRect).Max.y;
            auVar23 = minps(auVar28,auVar24);
            fVar31 = (pIVar14->ClipRect).Min.x;
            uVar21 = -(uint)(fVar31 <= fVar33);
            local_80.y = (float)(~uVar22 & (uint)fVar30 | (uint)IVar35.Min.y & uVar22);
            local_80.x = (float)(~uVar21 & (uint)fVar31 | (uint)fVar33 & uVar21);
            auVar27 = auVar23;
            if (pIVar14->MaxX <= auVar23._0_4_) {
              auVar27._4_12_ = auVar23._4_12_;
              auVar27._0_4_ = pIVar14->MaxX;
            }
            local_78.y = auVar23._4_4_;
            local_78.x = auVar27._0_4_;
            ImDrawList::AddRectFilled(pIVar6->DrawList,&local_80,&local_78,pIVar19->BgColor,0.0,0);
            pIVar19 = pIVar19 + 1;
          } while (pIVar19 <= pIVar1);
          goto LAB_00196dc6;
        }
      }
      __function = "T &ImSpan<ImGuiTableCellData>::operator[](int) [T = ImGuiTableCellData]";
      goto LAB_00197062;
    }
LAB_00196dc6:
    if (((local_70 != 0) && ((table->BgClipRect).Min.y <= (float)local_58._0_4_)) &&
       ((float)local_58._0_4_ < (table->BgClipRect).Max.y)) {
      local_80.y = (float)local_58._0_4_;
      local_80.x = table->BorderX1;
      local_60.x = table->BorderX2;
      local_60.y = (float)local_58._0_4_;
      ImDrawList::AddLine(pIVar6->DrawList,&local_80,&local_60,local_70,1.0);
    }
    iVar17 = local_64;
    iVar20 = local_68;
    iVar18 = local_6c;
    if (((local_6c == local_64) && ((table->BgClipRect).Min.y <= (float)local_48._0_4_)) &&
       ((float)local_48._0_4_ < (table->BgClipRect).Max.y)) {
      local_80.y = (float)local_48._0_4_;
      local_80.x = table->BorderX1;
      local_60.x = table->BorderX2;
      local_60.y = (float)local_48._0_4_;
      ImDrawList::AddLine(pIVar6->DrawList,&local_80,&local_60,table->BorderColorStrong,1.0);
    }
  }
  if ((iVar18 == iVar20) && (iVar12 = table->ColumnsCount, 0 < (long)iVar12)) {
    pIVar14 = (table->Columns).Data;
    lVar15 = 0;
    do {
      if ((table->Columns).DataEnd <= pIVar14) goto LAB_0019704d;
      pIVar14->NavLayerCurrent = lVar15 < table->FreezeColumnsCount;
      lVar15 = lVar15 + 1;
      pIVar14 = pIVar14 + 1;
    } while (iVar12 != lVar15);
  }
  if (iVar18 != iVar17) {
LAB_00197028:
    if ((table->field_0x98 & 1) == 0) {
      table->RowBgColorCounter = table->RowBgColorCounter + 1;
    }
    table->IsInsideRow = false;
    return;
  }
  if (table->IsUnfrozenRows != false) {
    __assert_fail("table->IsUnfrozenRows == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x736,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  table->IsUnfrozenRows = true;
  fVar31 = table->RowPosY2;
  fVar30 = (pIVar6->InnerClipRect).Min.y;
  fVar33 = (pIVar6->InnerClipRect).Max.y;
  uVar21 = -(uint)(fVar30 <= fVar31 + 1.0);
  fVar30 = (float)(~uVar21 & (uint)fVar30 | (uint)(fVar31 + 1.0) & uVar21);
  if (fVar33 <= fVar30) {
    fVar30 = fVar33;
  }
  (table->Bg2ClipRectForDrawCmd).Min.y = fVar30;
  (table->BgClipRect).Min.y = fVar30;
  (table->Bg2ClipRectForDrawCmd).Max.y = fVar33;
  (table->BgClipRect).Max.y = fVar33;
  table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
  if (fVar33 < fVar30) {
    __assert_fail("table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0x73e,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  fVar33 = table->RowPosY1;
  fVar25 = (fVar31 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
  (pIVar6->DC).CursorPos.y = fVar25;
  table->RowPosY2 = fVar25;
  table->RowPosY1 = fVar25 - (fVar31 - fVar33);
  lVar15 = (long)table->ColumnsCount;
  pIVar14 = (table->Columns).Data;
  pIVar16 = pIVar14;
  if (0 < lVar15) {
    do {
      if ((table->Columns).DataEnd <= pIVar16) goto LAB_0019704d;
      pIVar16->DrawChannelCurrent = pIVar16->DrawChannelUnfrozen;
      (pIVar16->ClipRect).Min.y = fVar30;
      lVar15 = lVar15 + -1;
      pIVar16 = pIVar16 + 1;
    } while (lVar15 != 0);
  }
  if (pIVar14 < (table->Columns).DataEnd) {
    IVar3 = (pIVar14->ClipRect).Min;
    IVar8 = (pIVar14->ClipRect).Max;
    IVar9 = (pIVar14->ClipRect).Max;
    (pIVar6->ClipRect).Min = (pIVar14->ClipRect).Min;
    (pIVar6->ClipRect).Max = IVar9;
    pIVar7 = pIVar6->DrawList;
    (pIVar7->_CmdHeader).ClipRect.x = IVar3.x;
    (pIVar7->_CmdHeader).ClipRect.y = IVar3.y;
    (pIVar7->_CmdHeader).ClipRect.z = IVar8.x;
    (pIVar7->_CmdHeader).ClipRect.w = IVar8.y;
    pIVar2 = (pIVar6->DrawList->_ClipRectStack).Data +
             (long)(pIVar6->DrawList->_ClipRectStack).Size + -1;
    pIVar2->x = IVar3.x;
    pIVar2->y = IVar3.y;
    pIVar2->z = IVar8.x;
    pIVar2->w = IVar8.y;
    pIVar14 = (table->Columns).Data;
    if (pIVar14 < (table->Columns).DataEnd) {
      ImDrawListSplitter::SetCurrentChannel
                (table->DrawSplitter,pIVar6->DrawList,(uint)pIVar14->DrawChannelCurrent);
      goto LAB_00197028;
    }
  }
LAB_0019704d:
  __function = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_00197062:
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_internal.h"
                ,0x255,__function);
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        TableGetInstanceData(table, table->InstanceCurrent)->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                // As we render the BG here we need to clip things (for layout we would not)
                // FIXME: This cancels the OuterPadding addition done by TableGetCellBgRect(), need to keep it while rendering correctly while scrolling.
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped when scrolling
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}